

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O3

void __thiscall ParserTestImplicitOutput::Run(ParserTestImplicitOutput *this)

{
  int iVar1;
  Edge *pEVar2;
  bool bVar3;
  Node *pNVar4;
  StringPiece path;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild foo | imp: cat bar\n");
  if (iVar1 == g_current_test->assertion_failures_) {
    path.len_ = 3;
    path.str_ = "imp";
    pNVar4 = State::LookupNode(&(this->super_ParserTest).state,path);
    pEVar2 = pNVar4->in_edge_;
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (long)(pEVar2->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pEVar2->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_start == 0x10,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x3d0,"edge->outputs_.size() == 2");
    if (bVar3) {
      testing::Test::Check
                (g_current_test,
                 (ulong)(((long)(pEVar2->outputs_).
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)(pEVar2->outputs_).
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3) -
                        (long)pEVar2->implicit_outs_) < 2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x3d1,"edge->is_implicit_out(1)");
      return;
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, ImplicitOutput) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build foo | imp: cat bar\n"));

  Edge* edge = state.LookupNode("imp")->in_edge();
  ASSERT_EQ(edge->outputs_.size(), 2);
  EXPECT_TRUE(edge->is_implicit_out(1));
}